

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O3

aom_codec_err_t
av1_firstpass_info_init
          (FIRSTPASS_INFO *firstpass_info,FIRSTPASS_STATS *ext_stats_buf,int ext_stats_buf_size)

{
  aom_codec_err_t aVar1;
  long lVar2;
  long lVar3;
  
  if (ext_stats_buf == (FIRSTPASS_STATS *)0x0) {
    firstpass_info->stats_buf = firstpass_info->static_stats_buf;
    firstpass_info->stats_buf_size = 0x31;
    aVar1 = (aom_codec_err_t)(ext_stats_buf_size != 0);
    memset(&firstpass_info->start_index,0,0xfc);
  }
  else {
    firstpass_info->stats_buf = ext_stats_buf;
    firstpass_info->stats_buf_size = ext_stats_buf_size;
    aVar1 = AOM_CODEC_OK;
    firstpass_info->start_index = 0;
    firstpass_info->cur_index = 0;
    firstpass_info->stats_count = ext_stats_buf_size;
    firstpass_info->future_stats_count = ext_stats_buf_size;
    memset(&firstpass_info->past_stats_count,0,0xec);
    if (0 < ext_stats_buf_size) {
      aVar1 = AOM_CODEC_OK;
      lVar2 = 0;
      lVar3 = 0;
      do {
        av1_accumulate_stats
                  (&firstpass_info->total_stats,
                   (FIRSTPASS_STATS *)((long)&firstpass_info->stats_buf->frame + lVar2));
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0xe8;
      } while (lVar3 < firstpass_info->stats_count);
    }
  }
  return aVar1;
}

Assistant:

aom_codec_err_t av1_firstpass_info_init(FIRSTPASS_INFO *firstpass_info,
                                        FIRSTPASS_STATS *ext_stats_buf,
                                        int ext_stats_buf_size) {
  assert(IMPLIES(ext_stats_buf == NULL, ext_stats_buf_size == 0));
  if (ext_stats_buf == NULL) {
    firstpass_info->stats_buf = firstpass_info->static_stats_buf;
    firstpass_info->stats_buf_size =
        sizeof(firstpass_info->static_stats_buf) /
        sizeof(firstpass_info->static_stats_buf[0]);
    firstpass_info->start_index = 0;
    firstpass_info->cur_index = 0;
    firstpass_info->stats_count = 0;
    firstpass_info->future_stats_count = 0;
    firstpass_info->past_stats_count = 0;
    av1_zero(firstpass_info->total_stats);
    if (ext_stats_buf_size == 0) {
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  } else {
    firstpass_info->stats_buf = ext_stats_buf;
    firstpass_info->stats_buf_size = ext_stats_buf_size;
    firstpass_info->start_index = 0;
    firstpass_info->cur_index = 0;
    firstpass_info->stats_count = firstpass_info->stats_buf_size;
    firstpass_info->future_stats_count = firstpass_info->stats_count;
    firstpass_info->past_stats_count = 0;
    av1_zero(firstpass_info->total_stats);
    for (int i = 0; i < firstpass_info->stats_count; ++i) {
      av1_accumulate_stats(&firstpass_info->total_stats,
                           &firstpass_info->stats_buf[i]);
    }
  }
  return AOM_CODEC_OK;
}